

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

char * Curl_checkheaders(Curl_easy *data,char *thisheader,size_t thislen)

{
  int iVar1;
  curl_slist *local_30;
  curl_slist *head;
  size_t thislen_local;
  char *thisheader_local;
  Curl_easy *data_local;
  
  local_30 = (data->set).headers;
  while( true ) {
    if (local_30 == (curl_slist *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Curl_strncasecompare(local_30->data,thisheader,thislen);
    if ((iVar1 != 0) && ((local_30->data[thislen] == ':' || (local_30->data[thislen] == ';'))))
    break;
    local_30 = local_30->next;
  }
  return local_30->data;
}

Assistant:

char *Curl_checkheaders(const struct Curl_easy *data,
                        const char *thisheader,
                        const size_t thislen)
{
  struct curl_slist *head;
  DEBUGASSERT(thislen);
  DEBUGASSERT(thisheader[thislen-1] != ':');

  for(head = data->set.headers; head; head = head->next) {
    if(strncasecompare(head->data, thisheader, thislen) &&
       Curl_headersep(head->data[thislen]) )
      return head->data;
  }

  return NULL;
}